

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjAddFirst(Rtm_Man_t *p,Rtm_Edg_t *pEdge,Rtm_Init_t Val)

{
  Rtm_Init_t Val_local;
  Rtm_Edg_t *pEdge_local;
  Rtm_Man_t *p_local;
  
  if (((ulong)*pEdge & 0xfff) == 10) {
    Rtm_ObjTransferToBig(p,pEdge);
  }
  else if (((ulong)*pEdge & 0xf) == 0xf) {
    Rtm_ObjTransferToBigger(p,pEdge);
  }
  if ((*(uint *)pEdge & 0xfff) < 10) {
    Rtm_ObjAddFirst1(pEdge,Val);
  }
  else {
    Rtm_ObjAddFirst2(p,pEdge,Val);
  }
  return;
}

Assistant:

static        void        Rtm_ObjAddFirst( Rtm_Man_t * p, Rtm_Edg_t * pEdge, Rtm_Init_t Val )  { if ( pEdge->nLats == 10 ) Rtm_ObjTransferToBig(p, pEdge); else if ( (pEdge->nLats & 15) == 15 ) Rtm_ObjTransferToBigger(p, pEdge); if ( pEdge->nLats >= 10 ) Rtm_ObjAddFirst2(p, pEdge, Val); else Rtm_ObjAddFirst1(pEdge, Val); }